

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseInputMessageContent_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  element_type *peVar1;
  __type_conflict _Var2;
  Ptr local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  peVar1 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string((string *)&local_50,"InputTextMessageContent",(allocator *)&local_60)
  ;
  _Var2 = std::operator==(&peVar1->type,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (_Var2) {
    std::static_pointer_cast<TgBot::InputTextMessageContent,TgBot::InputMessageContent>
              ((shared_ptr<TgBot::InputMessageContent> *)&local_60);
    parseInputTextMessageContent_abi_cxx11_(&local_50,this,(Ptr *)&local_60);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    peVar1 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__cxx11::string::string
              ((string *)&local_50,"InputLocationMessageContent",(allocator *)&local_60);
    _Var2 = std::operator==(&peVar1->type,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) {
      std::static_pointer_cast<TgBot::InputLocationMessageContent,TgBot::InputMessageContent>
                ((shared_ptr<TgBot::InputMessageContent> *)&local_60);
      parseInputLocationMessageContent_abi_cxx11_(&local_50,this,(Ptr *)&local_60);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      peVar1 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      std::__cxx11::string::string
                ((string *)&local_50,"InputVenueMessageContent",(allocator *)&local_60);
      _Var2 = std::operator==(&peVar1->type,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var2) {
        std::static_pointer_cast<TgBot::InputVenueMessageContent,TgBot::InputMessageContent>
                  ((shared_ptr<TgBot::InputMessageContent> *)&local_60);
        parseInputVenueMessageContent_abi_cxx11_(&local_50,this,(Ptr *)&local_60);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        peVar1 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        std::__cxx11::string::string
                  ((string *)&local_50,"InputContactMessageContent",(allocator *)&local_60);
        _Var2 = std::operator==(&peVar1->type,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (!_Var2) goto LAB_001eef62;
        std::static_pointer_cast<TgBot::InputContactMessageContent,TgBot::InputMessageContent>
                  ((shared_ptr<TgBot::InputMessageContent> *)&local_60);
        parseInputContactMessageContent_abi_cxx11_(&local_50,(TgTypeParser *)object,&local_60);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.
              super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_001eef62:
  removeLastComma(this,__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseInputMessageContent(const InputMessageContent::Ptr& object) const {
    if (!object){
        return "";
    }

    string result;
    result += '{';

    if (object->type == std::string("InputTextMessageContent")) {
        result += parseInputTextMessageContent(static_pointer_cast<InputTextMessageContent>(object));
    }
    else if (object->type == std::string("InputLocationMessageContent")) {
        result += parseInputLocationMessageContent(static_pointer_cast<InputLocationMessageContent>(object));
    }
    else if (object->type == std::string("InputVenueMessageContent")) {
        result += parseInputVenueMessageContent(static_pointer_cast<InputVenueMessageContent>(object));
    }
    else if (object->type == std::string("InputContactMessageContent")) {
        result += parseInputContactMessageContent(static_pointer_cast<InputContactMessageContent>(object));
    }

    removeLastComma(result);
    result += '}';
    return result;
}